

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::GridSample_x86_avx512::forward
          (GridSample_x86_avx512 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  Mat *src;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ulong uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  Option *pOVar22;
  long lVar23;
  undefined8 *puVar24;
  void *pvVar25;
  long lVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  undefined1 (*pauVar30) [32];
  int *offset_ptr;
  int *piVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  float fVar50;
  undefined1 auVar51 [16];
  float fVar52;
  undefined1 in_ZMM11 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  Mat local_d8;
  size_t local_90;
  int local_88;
  uint local_84;
  pointer local_80;
  Mat local_78;
  
  auVar49 = in_ZMM11._0_16_;
  src = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
  local_80 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
  local_88 = src->elempack;
  iVar28 = src->c;
  local_84 = src->dims;
  local_90 = src->elemsize;
  local_d8.cstep = 0;
  local_d8.data = (int *)0x0;
  local_d8.refcount._0_4_ = 0;
  local_d8.refcount._4_4_ = 0;
  local_d8.elemsize._0_4_ = 0;
  local_d8._20_8_ = 0;
  local_d8.allocator = (Allocator *)0x0;
  local_d8.dims = 0;
  local_d8.w = 0;
  local_d8.h = 0;
  local_d8.d = 0;
  local_d8.c = 0;
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78.elemsize._4_4_ = 0;
  local_78.elempack = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  if (src[1].elempack == 1) {
    if (&local_78 != src + 1) {
      piVar31 = src[1].refcount;
      if (piVar31 != (int *)0x0) {
        LOCK();
        *piVar31 = *piVar31 + 1;
        UNLOCK();
      }
      local_78.data = src[1].data;
      local_78.refcount._0_4_ = SUB84(src[1].refcount,0);
      local_78.refcount._4_4_ = (undefined4)((ulong)src[1].refcount >> 0x20);
      local_78.elemsize._0_4_ = (undefined4)src[1].elemsize;
      local_78.elemsize._4_4_ = (undefined4)(src[1].elemsize >> 0x20);
      local_78.elempack = src[1].elempack;
      local_78.allocator = src[1].allocator;
      uVar14 = src[1].dims;
      uVar15 = src[1].w;
      uVar16 = src[1].h;
      uVar17 = src[1].d;
      local_78.c = src[1].c;
      local_78.cstep = src[1].cstep;
      local_78.dims = uVar14;
      local_78.w = uVar15;
      local_78.h = uVar16;
      local_78.d = uVar17;
    }
  }
  else {
    convert_packing(src + 1,&local_78,1,opt);
  }
  if (local_84 == 3) {
    iVar27 = local_78.h;
    iVar20 = local_78.w;
    if ((this->super_GridSample).permute_fusion == 0) {
      iVar27 = local_78.c;
      iVar20 = local_78.h;
    }
    Mat::create(local_80,iVar20,iVar27,iVar28,local_90,local_88,opt->blob_allocator);
    iVar28 = -100;
    if ((local_80->data == (void *)0x0) || ((long)local_80->c * local_80->cstep == 0))
    goto LAB_0059489f;
    iVar18 = (this->super_GridSample).sample_type;
    if (iVar18 == 1) {
      Mat::create(&local_d8,iVar20,iVar27,local_90 * 6,6,opt->workspace_allocator);
      if (((int *)local_d8.data == (int *)0x0) || ((long)local_d8.c * local_d8.cstep == 0))
      goto LAB_0059489f;
      iVar18 = (this->super_GridSample).padding_mode;
      if (iVar18 == 3) {
        iVar18 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_78,&local_d8,iVar18);
        }
        else {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_78,&local_d8,iVar18);
        }
      }
      else if (iVar18 == 2) {
        iVar18 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_78,&local_d8,iVar18);
        }
        else {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_78,&local_d8,iVar18);
        }
      }
      else {
        if (iVar18 != 1) {
          forward();
          goto LAB_0059489f;
        }
        iVar18 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_78,&local_d8,iVar18);
        }
        else {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_78,&local_d8,iVar18);
        }
      }
      iVar18 = (this->super_GridSample).sample_type;
    }
    if (iVar18 == 2) {
      Mat::create(&local_d8,iVar20,iVar27,1,local_90,1,opt->workspace_allocator);
      if (((int *)local_d8.data == (int *)0x0) || ((long)local_d8.c * local_d8.cstep == 0))
      goto LAB_0059489f;
      iVar18 = (this->super_GridSample).padding_mode;
      if (iVar18 == 3) {
        iVar18 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_78,&local_d8,iVar18);
        }
        else {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_78,&local_d8,iVar18);
        }
      }
      else if (iVar18 == 2) {
        iVar18 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_78,&local_d8,iVar18);
        }
        else {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_78,&local_d8,iVar18);
        }
      }
      else {
        if (iVar18 != 1) {
          forward();
          goto LAB_0059489f;
        }
        iVar18 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_78,&local_d8,iVar18);
        }
        else {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_78,&local_d8,iVar18);
        }
      }
    }
    if ((this->super_GridSample).sample_type == 3) {
      Mat::create(&local_d8,iVar20,iVar27,local_90 * 0x12,0x12,opt->workspace_allocator);
      if (((int *)local_d8.data == (int *)0x0) || ((long)local_d8.c * local_d8.cstep == 0))
      goto LAB_0059489f;
      iVar27 = (this->super_GridSample).padding_mode;
      if (iVar27 == 3) {
        iVar28 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_78,&local_d8,iVar28);
        }
        else {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_78,&local_d8,iVar28);
        }
      }
      else if (iVar27 == 2) {
        iVar28 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_78,&local_d8,iVar28);
        }
        else {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_78,&local_d8,iVar28);
        }
      }
      else {
        if (iVar27 != 1) {
          forward();
          goto LAB_0059489f;
        }
        iVar28 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_78,&local_d8,iVar28);
        }
        else {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_78,&local_d8,iVar28);
        }
      }
    }
LAB_005941e0:
    bVar9 = false;
  }
  else {
    if (local_84 != 4) goto LAB_005941e0;
    iVar27 = local_78.d;
    iVar20 = local_78.w;
    iVar18 = local_78.h;
    if ((this->super_GridSample).permute_fusion == 0) {
      iVar27 = local_78.c;
      iVar20 = local_78.h;
      iVar18 = local_78.d;
    }
    Mat::create(local_80,iVar20,iVar18,iVar27,iVar28,local_90,local_88,opt->blob_allocator);
    iVar28 = -100;
    if ((local_80->data == (void *)0x0) || ((long)local_80->c * local_80->cstep == 0))
    goto LAB_0059489f;
    iVar19 = (this->super_GridSample).sample_type;
    if (iVar19 == 1) {
      Mat::create(&local_d8,iVar20,iVar18,iVar27,local_90 * 0xb,0xb,opt->workspace_allocator);
      if (((int *)local_d8.data == (int *)0x0) || ((long)local_d8.c * local_d8.cstep == 0))
      goto LAB_0059489f;
      iVar19 = (this->super_GridSample).padding_mode;
      if (iVar19 == 3) {
        iVar19 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_78,&local_d8,iVar19);
        }
        else {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_78,&local_d8,iVar19);
        }
      }
      else if (iVar19 == 2) {
        iVar19 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_78,&local_d8,iVar19);
        }
        else {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_78,&local_d8,iVar19);
        }
      }
      else {
        if (iVar19 != 1) {
          forward();
          goto LAB_0059489f;
        }
        iVar19 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_78,&local_d8,iVar19);
        }
        else {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_78,&local_d8,iVar19);
        }
      }
      iVar19 = (this->super_GridSample).sample_type;
    }
    if (iVar19 == 2) {
      Mat::create(&local_d8,iVar20,iVar18,iVar27,1,local_90,1,opt->workspace_allocator);
      if (((int *)local_d8.data == (int *)0x0) || ((long)local_d8.c * local_d8.cstep == 0))
      goto LAB_0059489f;
      iVar27 = (this->super_GridSample).padding_mode;
      if (iVar27 == 3) {
        iVar27 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_78,&local_d8,iVar27);
        }
        else {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_78,&local_d8,iVar27);
        }
      }
      else if (iVar27 == 2) {
        iVar27 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_78,&local_d8,iVar27);
        }
        else {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_78,&local_d8,iVar27);
        }
      }
      else {
        if (iVar27 != 1) {
          forward();
          goto LAB_0059489f;
        }
        iVar27 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_78,&local_d8,iVar27);
        }
        else {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_78,&local_d8,iVar27);
        }
      }
    }
    bVar9 = true;
    if ((this->super_GridSample).sample_type == 3) {
      forward();
      goto LAB_0059489f;
    }
  }
  iVar27 = 0;
  iVar28 = iVar27;
  if (7 < local_88) {
    pOVar22 = (Option *)(ulong)local_84;
    if (local_88 != 8) {
      if (local_88 != 0x10) goto LAB_0059489f;
      if (local_84 == 3) {
        iVar27 = (this->super_GridSample).sample_type;
        if (iVar27 == 3) {
          gridsample_2d_bicubic_apply_interpolation_p16(src,local_80,&local_d8,pOVar22);
          goto LAB_0059489f;
        }
        if (iVar27 != 2) {
          if (iVar27 == 1) {
            gridsample_2d_bilinear_apply_interpolation_p16(src,local_80,&local_d8,pOVar22);
          }
          goto LAB_0059489f;
        }
      }
      else {
        if (!bVar9) goto LAB_0059489f;
        iVar27 = (this->super_GridSample).sample_type;
        if (iVar27 != 2) {
          if (iVar27 == 1) {
            gridsample_3d_bilinear_apply_interpolation_p16(src,local_80,&local_d8,pOVar22);
          }
          goto LAB_0059489f;
        }
      }
      gridsample_nearest_apply_interpolation_p16(src,local_80,&local_d8,pOVar22);
      goto LAB_0059489f;
    }
    if (local_84 == 3) {
      iVar27 = (this->super_GridSample).sample_type;
      if (iVar27 == 3) {
        gridsample_2d_bicubic_apply_interpolation_p8(src,local_80,&local_d8,pOVar22);
        goto LAB_0059489f;
      }
      if (iVar27 != 2) {
        if (iVar27 == 1) {
          gridsample_2d_bilinear_apply_interpolation_p8(src,local_80,&local_d8,pOVar22);
        }
        goto LAB_0059489f;
      }
    }
    else {
      if (!bVar9) goto LAB_0059489f;
      iVar27 = (this->super_GridSample).sample_type;
      if (iVar27 != 2) {
        if (iVar27 == 1) {
          gridsample_3d_bilinear_apply_interpolation_p8(src,local_80,&local_d8,pOVar22);
        }
        goto LAB_0059489f;
      }
    }
    gridsample_nearest_apply_interpolation_p8(src,local_80,&local_d8,pOVar22);
    goto LAB_0059489f;
  }
  pOVar22 = (Option *)(ulong)local_84;
  if (local_88 != 1) {
    iVar28 = 0;
    if (local_88 != 4) goto LAB_0059489f;
    if (local_84 == 3) {
      iVar20 = (this->super_GridSample).sample_type;
      if (iVar20 == 3) {
        gridsample_2d_bicubic_apply_interpolation_p4(src,local_80,&local_d8,pOVar22);
        iVar28 = iVar27;
        goto LAB_0059489f;
      }
      if (iVar20 != 2) {
        if (iVar20 == 1) {
          gridsample_2d_bilinear_apply_interpolation_p4(src,local_80,&local_d8,pOVar22);
          iVar28 = iVar27;
        }
        goto LAB_0059489f;
      }
    }
    else {
      iVar28 = iVar27;
      if (!bVar9) goto LAB_0059489f;
      iVar20 = (this->super_GridSample).sample_type;
      if (iVar20 != 2) {
        if (iVar20 == 1) {
          gridsample_3d_bilinear_apply_interpolation_p4(src,local_80,&local_d8,pOVar22);
        }
        goto LAB_0059489f;
      }
    }
    gridsample_nearest_apply_interpolation_p4(src,local_80,&local_d8,pOVar22);
    iVar28 = iVar27;
    goto LAB_0059489f;
  }
  if (local_84 == 3) {
    iVar27 = (this->super_GridSample).sample_type;
    if (iVar27 == 3) {
      iVar27 = local_80->c;
      if (0 < (long)iVar27) {
        uVar21 = local_80->h * local_80->w;
        pvVar4 = src->data;
        sVar5 = src->elemsize;
        sVar6 = src->cstep;
        pvVar25 = local_80->data;
        lVar26 = local_80->elemsize * local_80->cstep;
        lVar23 = 0;
        auVar51 = vpmovsxbd_avx(ZEXT416(0xc080400));
        auVar10 = vpmovsxbd_avx(ZEXT416(0xd090501));
        auVar11 = vpmovsxbd_avx(ZEXT416(0xe0a0602));
        auVar12 = vpmovsxbd_avx(ZEXT416(0xf0b0703));
        auVar49 = vpcmpeqd_avx(auVar49,auVar49);
        auVar53._8_4_ = 0x3fa00000;
        auVar53._0_8_ = 0x3fa000003fa00000;
        auVar53._12_4_ = 0x3fa00000;
        auVar54._8_4_ = 0xc0100000;
        auVar54._0_8_ = 0xc0100000c0100000;
        auVar54._12_4_ = 0xc0100000;
        auVar55._8_4_ = 0x3f800000;
        auVar55._0_8_ = 0x3f8000003f800000;
        auVar55._12_4_ = 0x3f800000;
        iVar28 = 0;
        do {
          if (0 < (int)uVar21) {
            puVar24 = (undefined8 *)(sVar5 * sVar6 * lVar23 + (long)pvVar4);
            lVar29 = 0;
            pauVar30 = (undefined1 (*) [32])((long)local_d8.data + 8);
            do {
              uVar2 = *(uint *)(pauVar30[-1] + 0x18);
              uVar3 = *(uint *)(pauVar30[-1] + 0x1c);
              auVar42 = SUB6416(ZEXT464(0x3f800000),0);
              auVar32 = vaddss_avx512f(ZEXT416(uVar3),auVar42);
              auVar33 = vsubss_avx512f(auVar42,ZEXT416(uVar3));
              auVar34 = vmulss_avx512f(ZEXT416(uVar2),ZEXT416(uVar2));
              auVar35 = vfmsub213ss_avx512f(SUB6416(ZEXT464(0x3f400000),0),auVar32,
                                            SUB6416(ZEXT464(0x40700000),0));
              auVar39 = ZEXT416(uVar2);
              auVar36 = vfmadd213ss_avx512f(SUB6416(ZEXT464(0x3fa00000),0),auVar39,
                                            SUB6416(ZEXT464(0xc0100000),0));
              auVar37 = vsubss_avx512f(auVar42,auVar39);
              auVar38 = vmulss_avx512f(auVar37,auVar37);
              auVar37 = vfmadd213ss_avx512f(auVar37,SUB6416(ZEXT464(0x3fa00000),0),
                                            SUB6416(ZEXT464(0xc0100000),0));
              auVar39 = vaddss_avx512f(auVar39,auVar42);
              auVar40 = vmulss_avx512f(auVar39,auVar39);
              auVar41 = vfmsub213ss_avx512f(SUB6416(ZEXT464(0x3f400000),0),auVar39,
                                            SUB6416(ZEXT464(0x40700000),0));
              auVar39 = vfmsub213ss_avx512f(auVar39,SUB6416(ZEXT464(0x40c00000),0),
                                            SUB6416(ZEXT464(0x40400000),0));
              auVar44 = vmovdqu64_avx512vl(pauVar30[1]);
              auVar34 = vfmadd213ss_avx512f(auVar36,auVar34,auVar42);
              auVar45 = vmovdqu64_avx512vl(*pauVar30);
              auVar46 = vmovdqa64_avx512vl(auVar45);
              auVar46 = vpermt2d_avx512vl(auVar46,ZEXT1632(auVar51),auVar44);
              auVar36 = vfnmsub231ss_avx512f(auVar39,auVar40,auVar41);
              auVar47 = vmovdqa64_avx512vl(auVar45);
              auVar47 = vpermt2d_avx512vl(auVar47,ZEXT1632(auVar10),auVar44);
              auVar48 = vmovdqa64_avx512vl(auVar45);
              auVar37 = vmulss_avx512f(auVar38,auVar37);
              auVar48 = vpermt2d_avx512vl(auVar48,ZEXT1632(auVar11),auVar44);
              auVar44 = vpermt2d_avx512vl(auVar45,ZEXT1632(auVar12),auVar44);
              auVar39 = auVar46._0_16_;
              uVar13 = vpcmpgtd_avx512vl(auVar39,auVar49);
              auVar38 = vaddss_avx512f(auVar34,auVar37);
              vpmovzxdq_avx512vl(auVar39);
              auVar39 = vpxord_avx512vl(auVar39,auVar39);
              auVar40 = vgatherqps_avx512vl(*(undefined8 *)((long)puVar24 + (ulong)uVar21 * 4));
              bVar9 = (bool)((byte)(uVar13 & 0xf) & 1);
              auVar41._0_8_ = (ulong)bVar9 * auVar40._0_8_ | (ulong)!bVar9 * auVar39._0_8_;
              bVar9 = (bool)((byte)((uVar13 & 0xf) >> 1) & 1);
              auVar41._8_8_ = (ulong)bVar9 * auVar40._8_8_ | (ulong)!bVar9 * auVar39._8_8_;
              auVar37 = vaddss_avx512f(auVar37,auVar42);
              auVar39 = vbroadcastss_avx512vl(auVar36);
              auVar34 = vbroadcastss_avx512vl(auVar34);
              uVar13 = vpcmpgtd_avx512vl(auVar47._0_16_,auVar49);
              auVar39 = vmulps_avx512vl(auVar41,auVar39);
              auVar45 = vpmovzxdq_avx512vl(auVar47._0_16_);
              auVar40 = vxorps_avx512vl(auVar41,auVar41);
              auVar41 = vgatherqps_avx512vl(*(undefined8 *)((long)puVar24 + lVar26 * 4));
              bVar9 = (bool)((byte)(uVar13 & 0xf) & 1);
              auVar42._0_8_ = (ulong)bVar9 * auVar41._0_8_ | (ulong)!bVar9 * auVar40._0_8_;
              bVar9 = (bool)((byte)((uVar13 & 0xf) >> 1) & 1);
              auVar42._8_8_ = (ulong)bVar9 * auVar41._8_8_ | (ulong)!bVar9 * auVar40._8_8_;
              auVar36 = vaddss_avx512f(auVar38,auVar36);
              uVar13 = vpcmpgtd_avx512vl(auVar48._0_16_,auVar49);
              vpmovzxdq_avx512vl(auVar48._0_16_);
              auVar38 = vxorps_avx512vl(auVar45._0_16_,auVar45._0_16_);
              auVar34 = vfmadd213ps_avx512vl(auVar42,auVar34,auVar39);
              auVar40 = vgatherqps_avx512vl(*(undefined8 *)((long)puVar24 + (long)pvVar25 * 4));
              bVar9 = (bool)((byte)(uVar13 & 0xf) & 1);
              auVar39._0_8_ = (ulong)bVar9 * auVar40._0_8_ | (ulong)!bVar9 * auVar38._0_8_;
              bVar9 = (bool)((byte)((uVar13 & 0xf) >> 1) & 1);
              auVar39._8_8_ = (ulong)bVar9 * auVar40._8_8_ | (ulong)!bVar9 * auVar38._8_8_;
              uVar13 = vpcmpgtd_avx512vl(auVar44._0_16_,auVar49);
              vpmovzxdq_avx512vl(auVar44._0_16_);
              auVar38 = vbroadcastss_avx512vl(auVar37);
              auVar37 = vxorps_avx512vl(auVar37,auVar37);
              auVar40 = vgatherqps_avx512vl(*puVar24);
              bVar9 = (bool)((byte)(uVar13 & 0xf) & 1);
              auVar43._0_8_ = (ulong)bVar9 * auVar40._0_8_ | (ulong)!bVar9 * auVar37._0_8_;
              bVar9 = (bool)((byte)((uVar13 & 0xf) >> 1) & 1);
              auVar43._8_8_ = (ulong)bVar9 * auVar40._8_8_ | (ulong)!bVar9 * auVar37._8_8_;
              auVar36 = vbroadcastss_avx512vl(auVar36);
              auVar37 = vfmsub213ss_avx512f(SUB6416(ZEXT464(0x40c00000),0),auVar32,
                                            SUB6416(ZEXT464(0x40400000),0));
              auVar32 = vmulss_avx512f(auVar32,auVar32);
              auVar35 = vfnmsub213ss_avx512f(auVar32,auVar35,auVar37);
              auVar34 = vfmadd213ps_avx512vl(auVar39,auVar38,auVar34);
              auVar32 = vinsertps_avx512f(ZEXT416(uVar3),auVar33,0x10);
              auVar33 = vmulps_avx512vl(auVar32,auVar32);
              auVar32 = vfmadd213ps_fma(auVar32,auVar53,auVar54);
              auVar34 = vfnmadd213ps_avx512vl(auVar43,auVar36,auVar34);
              auVar32 = vmulps_avx512vl(auVar33,auVar32);
              auVar33 = vaddps_avx512vl(auVar32,auVar55);
              auVar32 = vmovshdup_avx(auVar32);
              auVar32 = vaddss_avx512f(auVar33,auVar32);
              auVar32 = vaddss_avx512f(auVar32,auVar35);
              auVar36 = vshufps_avx512vl(auVar34,auVar34,0xe9);
              auVar33 = vmulps_avx512vl(auVar36,auVar33);
              auVar35 = vfmadd213ss_avx512f(auVar35,auVar34,auVar33);
              auVar33 = vmovshdup_avx512vl(auVar33);
              auVar33 = vaddss_avx512f(auVar35,auVar33);
              auVar34 = vshufps_avx512vl(auVar34,auVar34,0xff);
              auVar32 = vfnmadd213ss_avx512f(auVar34,auVar32,auVar33);
              *(int *)((long)pvVar25 + lVar29 * 4) = auVar32._0_4_;
              lVar29 = lVar29 + 1;
              pauVar30 = (undefined1 (*) [32])(pauVar30[2] + 8);
            } while (uVar21 != (uint)lVar29);
          }
          lVar23 = lVar23 + 1;
          pvVar25 = (void *)((long)pvVar25 + lVar26);
        } while (lVar23 != iVar27);
      }
      goto LAB_0059489f;
    }
    if (iVar27 != 2) {
      if ((iVar27 == 1) && (iVar27 = local_80->c, 0 < (long)iVar27)) {
        iVar20 = local_80->h * local_80->w;
        pvVar4 = src->data;
        sVar5 = src->elemsize;
        sVar6 = src->cstep;
        pvVar25 = local_80->data;
        sVar7 = local_80->elemsize;
        sVar8 = local_80->cstep;
        lVar26 = 0;
        iVar28 = 0;
        do {
          if (0 < iVar20) {
            lVar23 = sVar5 * sVar6 * lVar26;
            lVar29 = 0;
            piVar31 = (int *)local_d8.data;
            do {
              fVar50 = 0.0;
              auVar49 = ZEXT816(0) << 0x40;
              if (-1 < (long)*piVar31) {
                auVar49 = ZEXT416(*(uint *)((long)pvVar4 + (long)*piVar31 * 4 + lVar23));
              }
              if (-1 < (long)piVar31[1]) {
                fVar50 = *(float *)((long)pvVar4 + (long)piVar31[1] * 4 + lVar23);
              }
              fVar52 = 0.0;
              auVar51 = ZEXT816(0) << 0x40;
              if (-1 < (long)piVar31[2]) {
                auVar51 = ZEXT416(*(uint *)((long)pvVar4 + (long)piVar31[2] * 4 + lVar23));
              }
              if (-1 < (long)piVar31[3]) {
                fVar52 = *(float *)((long)pvVar4 + (long)piVar31[3] * 4 + lVar23);
              }
              fVar1 = (float)piVar31[4];
              auVar49 = vfmadd213ss_fma(auVar49,ZEXT416((uint)(1.0 - fVar1)),
                                        ZEXT416((uint)(fVar1 * fVar50)));
              auVar51 = vfmadd213ss_fma(auVar51,ZEXT416((uint)(1.0 - fVar1)),
                                        ZEXT416((uint)(fVar1 * fVar52)));
              auVar49 = vfmadd132ss_fma(ZEXT416((uint)(auVar51._0_4_ - auVar49._0_4_)),auVar49,
                                        ZEXT416((uint)piVar31[5]));
              *(int *)((long)pvVar25 + lVar29 * 4) = auVar49._0_4_;
              piVar31 = piVar31 + 6;
              lVar29 = lVar29 + 1;
            } while (iVar20 != (int)lVar29);
          }
          lVar26 = lVar26 + 1;
          pvVar25 = (void *)((long)pvVar25 + sVar7 * sVar8);
        } while (lVar26 != iVar27);
      }
      goto LAB_0059489f;
    }
  }
  else {
    if (!bVar9) goto LAB_0059489f;
    iVar27 = (this->super_GridSample).sample_type;
    if (iVar27 != 2) {
      if (iVar27 == 1) {
        gridsample_3d_bilinear_apply_interpolation_p1(src,local_80,&local_d8,pOVar22);
      }
      goto LAB_0059489f;
    }
  }
  gridsample_nearest_apply_interpolation_p1(src,local_80,&local_d8,pOVar22);
LAB_0059489f:
  piVar31 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar31 != (int *)0x0) {
    LOCK();
    *piVar31 = *piVar31 + -1;
    UNLOCK();
    if (*piVar31 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar31 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
  if (piVar31 != (int *)0x0) {
    LOCK();
    *piVar31 = *piVar31 + -1;
    UNLOCK();
    if (*piVar31 == 0) {
      if (local_d8.allocator == (Allocator *)0x0) {
        if ((int *)local_d8.data != (int *)0x0) {
          free(local_d8.data);
        }
      }
      else {
        (*(local_d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar28;
}

Assistant:

int GridSample_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& grid = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];
    int elempack = bottom_blob.elempack;

    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int outw, outh, outd;
    Mat offset_value_blob;

    Mat grid_p1;
    if (grid.elempack != 1)
    {
        convert_packing(grid, grid_p1, 1, opt);
    }
    else
    {
        grid_p1 = grid;
    }

    if (dims == 3)
    {
        outw = permute_fusion == 0 ? grid_p1.h : grid_p1.w;
        outh = permute_fusion == 0 ? grid_p1.c : grid_p1.h;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (sample_type == GridSample::Interpolation_BILINEAR)
        {
            offset_value_blob.create(outw, outh, elemsize * 6, 6, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == GridSample::Interpolation_NEAREST)
        {
            offset_value_blob.create(outw, outh, 1, elemsize, 1, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == GridSample::Interpolation_BICUBIC)
        {
            offset_value_blob.create(outw, outh, elemsize * 18, 18, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }
    }

    if (dims == 4)
    {
        outw = permute_fusion == 0 ? grid_p1.h : grid_p1.w;
        outh = permute_fusion == 0 ? grid_p1.d : grid_p1.h;
        outd = permute_fusion == 0 ? grid_p1.c : grid_p1.d;

        top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (sample_type == GridSample::Interpolation_BILINEAR)
        {
            offset_value_blob.create(outw, outh, outd, elemsize * 11, 11, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == GridSample::Interpolation_NEAREST)
        {
            offset_value_blob.create(outw, outh, outd, 1, elemsize, 1, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == 3)
        {
            NCNN_LOGE("unsupported bicubic when dims == 4");
            return -100;
        }
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }

#endif // __AVX__
    if (elempack == 4)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }

#endif // __SSE2__

    if (elempack == 1)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }

    return 0;
}